

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingBuffer.h
# Opt level: O3

void __thiscall Deque<int,_std::allocator<int>_>::level_down(Deque<int,_std::allocator<int>_> *this)

{
  ulong uVar1;
  DataBlock **ppDVar2;
  DataBlock **ppDVar3;
  DataBlock **ppDVar4;
  DataBlock **ppDVar5;
  DataBlock **ppDVar6;
  DataBlock **ppDVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  DataBlock **__tmp;
  
  uVar1 = (this->small_).allocSize_;
  if (uVar1 < 8) {
    return;
  }
  ppDVar2 = (this->big_).end_;
  (this->big_).end_ = (this->current_).end_;
  ppDVar3 = (this->small_).begin_;
  ppDVar4 = (this->big_).arr_;
  ppDVar5 = (this->big_).begin_;
  ppDVar6 = (this->current_).arr_;
  ppDVar7 = (this->current_).begin_;
  (this->current_).arr_ = (this->small_).arr_;
  (this->current_).begin_ = ppDVar3;
  (this->big_).arr_ = ppDVar6;
  (this->big_).begin_ = ppDVar7;
  (this->small_).arr_ = ppDVar4;
  (this->small_).begin_ = ppDVar5;
  sVar8 = (this->small_).size_;
  sVar9 = (this->current_).size_;
  sVar10 = (this->current_).allocSize_;
  (this->current_).end_ = (this->small_).end_;
  (this->current_).size_ = sVar8;
  (this->small_).end_ = ppDVar2;
  sVar8 = (this->big_).size_;
  sVar11 = (this->big_).allocSize_;
  (this->current_).allocSize_ = uVar1;
  (this->big_).size_ = sVar9;
  (this->big_).allocSize_ = sVar10;
  (this->small_).size_ = sVar8;
  (this->small_).allocSize_ = sVar11;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::reset_and_resize(&this->small_,uVar1 >> 1);
  return;
}

Assistant:

std::size_t max_size() const {
        return allocSize_;
    }